

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataTemplatedWithinCollectionScatter<unsigned_char>
               (Vector *param_1,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *param_5,Vector *param_6,Vector *heap_locations,
               idx_t param_8,UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *param_10)

{
  SelectionVector *pSVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  byte bVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  TemplatedValidityData<unsigned_char> *pTVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  idx_t iVar12;
  idx_t iVar13;
  long *plVar14;
  data_ptr_t pdVar15;
  ulong uVar16;
  data_ptr_t pdVar17;
  _Head_base<0UL,_unsigned_char_*,_false> local_78;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true> local_70;
  unsigned_long local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  data_ptr_t local_48;
  data_ptr_t local_40;
  unsigned_long local_38;
  
  if (append_count != 0) {
    pSVar1 = list_data->sel;
    pdVar15 = list_data->data;
    pSVar2 = (source_format->unified).sel;
    pdVar3 = (source_format->unified).data;
    pdVar17 = heap_locations->data;
    iVar12 = 0;
    local_48 = pdVar17;
    local_40 = pdVar15;
    do {
      iVar13 = iVar12;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar13 = (idx_t)append_sel->sel_vector[iVar12];
      }
      psVar4 = pSVar1->sel_vector;
      if (psVar4 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar4[iVar13];
      }
      puVar5 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (((puVar5 == (unsigned_long *)0x0) || ((puVar5[iVar13 >> 6] >> (iVar13 & 0x3f) & 1) != 0))
         && (*(long *)(pdVar15 + iVar13 * 0x10 + 8) != 0)) {
        plVar14 = (long *)(pdVar15 + iVar13 * 0x10);
        local_78._M_head_impl = *(uchar **)(pdVar17 + iVar12 * 8);
        local_60 = plVar14[1];
        local_70.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_70.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uVar11 = plVar14[1];
        if (local_78._M_head_impl == (uchar *)0x0) {
          local_38 = local_60;
          make_buffer<duckdb::TemplatedValidityData<unsigned_char>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var7 = p_Stack_50;
          local_70.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_58;
          this._M_pi = local_70.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_70.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true>::operator->
                             (&local_70);
          local_78._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        }
        pdVar17 = local_48;
        if (uVar11 != 0) {
          lVar9 = (uVar11 + 7 >> 3) - 1;
          if (lVar9 != 0) {
            lVar10 = 0;
            do {
              local_78._M_head_impl[lVar10] = 0xff;
              lVar10 = lVar10 + 1;
            } while (lVar9 != lVar10);
          }
          local_78._M_head_impl[lVar9] =
               local_78._M_head_impl[lVar9] | -((uVar11 & 7) == 0) | ~(-1 << ((byte)uVar11 & 7));
        }
        lVar9 = (plVar14[1] + 7U >> 3) + *(long *)(local_48 + iVar12 * 8);
        *(long *)(local_48 + iVar12 * 8) = plVar14[1] + lVar9;
        if (plVar14[1] != 0) {
          uVar11 = 0;
          do {
            uVar16 = *plVar14 + uVar11;
            psVar4 = pSVar2->sel_vector;
            if (psVar4 != (sel_t *)0x0) {
              uVar16 = (ulong)psVar4[uVar16];
            }
            puVar5 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                     validity_mask;
            if ((puVar5 == (unsigned_long *)0x0) ||
               ((puVar5[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)) {
              *(data_t *)(lVar9 + uVar11) = pdVar3[uVar16];
            }
            else {
              bVar6 = (byte)uVar11 & 7;
              local_78._M_head_impl[uVar11 >> 3] =
                   local_78._M_head_impl[uVar11 >> 3] & (-2 << bVar6 | 0xfeU >> 8 - bVar6);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)plVar14[1]);
        }
        pdVar15 = local_40;
        if (local_70.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          pdVar15 = local_40;
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != append_count);
  }
  return;
}

Assistant:

static void TupleDataTemplatedWithinCollectionScatter(const Vector &, const TupleDataVectorFormat &source_format,
                                                      const SelectionVector &append_sel, const idx_t append_count,
                                                      const TupleDataLayout &, const Vector &, Vector &heap_locations,
                                                      const idx_t, const UnifiedVectorFormat &list_data,
                                                      const vector<TupleDataScatterFunction> &) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<T>(source_data);
	const auto &source_validity = source_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto child_data_location = target_heap_location;
		target_heap_location += list_length * TupleDataWithinListFixedSize<T>();

		// Store the data and validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_source_idx = source_sel.get_index(list_offset + child_i);
			if (source_validity.RowIsValid(child_source_idx)) {
				TupleDataWithinListValueStore<T>(data[child_source_idx],
				                                 child_data_location + child_i * TupleDataWithinListFixedSize<T>(),
				                                 target_heap_location);
			} else {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}
}